

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_recovery.cc
# Opt level: O0

void __thiscall
ClockRecovery::work(ClockRecovery *this,
                   shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                        *qout)

{
  bool bVar1;
  element_type *peVar2;
  int __fd;
  float *in_RDI;
  float fVar3;
  Samples *extraout_XMM0_Qa;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *extraout_XMM0_Qa_00;
  SamplePublisher *extraout_XMM0_Qb;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *extraout_XMM0_Qb_00;
  float mm;
  complex<float> u;
  complex<float> y;
  complex<float> x;
  int k;
  float *taps;
  complex<float> acc;
  complex<float> *s;
  int mui;
  float muf;
  size_t i;
  size_type nsamples;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  output;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_fffffffffffffdb8;
  __normal_iterator<const_std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffdc0;
  __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_fffffffffffffdd8;
  const_iterator __last;
  const_iterator in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_fffffffffffffe00;
  __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  in_stack_fffffffffffffe08;
  __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  in_stack_fffffffffffffe10;
  const_iterator in_stack_fffffffffffffe18;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffe20;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffe38;
  Samples *in_stack_fffffffffffffe48;
  SamplePublisher *in_stack_fffffffffffffe50;
  complex<float> local_dc [8];
  int local_9c;
  float (*local_98) [8];
  complex<float> local_90;
  reference local_88;
  int local_80;
  float local_7c;
  ulong local_78;
  size_type local_70;
  complex<float> *local_60;
  complex<float> *local_58;
  complex<float> *local_50;
  complex<float> *local_48;
  undefined4 local_30;
  
  peVar2 = std::
           __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12f45c);
  __fd = (int)peVar2;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             in_stack_fffffffffffffde8._M_current);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                      *)0x12f479);
  if (bVar1) {
    std::
    __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f4ca);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              (in_stack_fffffffffffffe38);
    local_48 = (complex<float> *)
               std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::end
                         (in_stack_fffffffffffffdb8);
    __gnu_cxx::
    __normal_iterator<std::complex<float>const*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
    ::__normal_iterator<std::complex<float>*>
              (in_stack_fffffffffffffdc0,
               (__normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)in_stack_fffffffffffffdb8);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x12f527);
    local_50 = (complex<float> *)
               std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::begin
                         (in_stack_fffffffffffffdb8);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x12f544);
    local_58 = (complex<float> *)
               std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::end
                         (in_stack_fffffffffffffdb8);
    local_60 = (complex<float> *)
               std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
               insert<__gnu_cxx::__normal_iterator<std::complex<float>*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>,void>
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffe18,
                          in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::
    __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f5a0);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)in_stack_fffffffffffffdc0,
                 (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)in_stack_fffffffffffffdb8);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                *)in_stack_fffffffffffffde8._M_current);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffdd0);
    local_70 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size
                         ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                          (in_RDI + 0x12));
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x12f617);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::clear
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x12f61f);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x12f62c);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::reserve
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (size_type)in_stack_fffffffffffffde8._M_current);
    local_78 = 0;
    while (local_78 < local_70) {
      local_7c = in_RDI[4];
      local_80 = (int)in_RDI[4];
      local_88 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                           ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                            (in_RDI + 0x12),local_78 + (long)local_80);
      if (local_70 <= local_78 + (long)local_80 + 7) break;
      local_78 = local_78 + (long)local_80;
      in_RDI[4] = in_RDI[4] - (float)local_80;
      local_7c = local_7c - (float)local_80;
      std::complex<float>::complex(&local_90,0.0,0.0);
      local_98 = mmseTaps + (int)(local_7c * 128.0);
      for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
        std::operator*((float *)in_stack_fffffffffffffdb8,(complex<float> *)0x12f872);
        std::complex<float>::operator+=
                  ((complex<float> *)in_stack_fffffffffffffdd0,
                   (complex<float> *)in_stack_fffffffffffffdc8);
      }
      *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RDI + 8);
      *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 6);
      *(_ComplexT *)(in_RDI + 6) = local_90._M_value;
      *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0xe);
      *(undefined8 *)(in_RDI + 0xe) = *(undefined8 *)(in_RDI + 0xc);
      fVar3 = std::complex<float>::real_abi_cxx11_((complex<float> *)(in_RDI + 6));
      std::complex<float>::real
                ((complex<float> *)(in_RDI + 0xc),(float)(-(uint)(0.0 < fVar3) & 0x3f800000));
      fVar3 = std::complex<float>::imag_abi_cxx11_((complex<float> *)(in_RDI + 6));
      std::complex<float>::imag
                ((complex<float> *)(in_RDI + 0xc),(float)(-(uint)(0.0 < fVar3) & 0x3f800000));
      std::
      unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
      ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                    *)0x12f9a3);
      std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::push_back
                ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                 in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
      std::operator-((complex<float> *)in_stack_fffffffffffffdb8,(complex<float> *)0x12f9d1);
      std::conj<float>((complex<float> *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffe48 = extraout_XMM0_Qa;
      in_stack_fffffffffffffe50 = extraout_XMM0_Qb;
      std::operator*((complex<float> *)in_stack_fffffffffffffdb8,(complex<float> *)0x12fa2d);
      std::operator-((complex<float> *)in_stack_fffffffffffffdb8,(complex<float> *)0x12fa60);
      std::conj<float>((complex<float> *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffe18._M_current = (complex<float> *)extraout_XMM0_Qa_00;
      in_stack_fffffffffffffe20 = extraout_XMM0_Qb_00;
      std::operator*((complex<float> *)in_stack_fffffffffffffdb8,(complex<float> *)0x12fab0);
      std::operator-((complex<float> *)in_stack_fffffffffffffdb8,(complex<float> *)0x12fada);
      fVar3 = std::complex<float>::real_abi_cxx11_(local_dc);
      fVar3 = (ABS(fVar3 + 1.0) - ABS(fVar3 - 1.0)) * 0.5;
      *in_RDI = in_RDI[3] * fVar3 + *in_RDI;
      if (*in_RDI < in_RDI[1]) {
        *in_RDI = in_RDI[2];
      }
      if (in_RDI[2] <= *in_RDI && *in_RDI != in_RDI[2]) {
        *in_RDI = in_RDI[1];
      }
      in_RDI[4] = in_RDI[5] * fVar3 + *in_RDI + in_RDI[4];
    }
    __last._M_current = (complex<float> *)(in_RDI + 0x12);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::begin
              (in_stack_fffffffffffffdb8);
    __gnu_cxx::
    __normal_iterator<std::complex<float>const*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
    ::__normal_iterator<std::complex<float>*>
              (in_stack_fffffffffffffdc0,
               (__normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)in_stack_fffffffffffffdb8);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::begin
              (in_stack_fffffffffffffdb8);
    __gnu_cxx::
    __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
    ::operator+(in_stack_fffffffffffffdc8,(difference_type)in_stack_fffffffffffffdc0);
    __gnu_cxx::
    __normal_iterator<std::complex<float>const*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
    ::__normal_iterator<std::complex<float>*>
              (in_stack_fffffffffffffdc0,
               (__normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)in_stack_fffffffffffffdb8);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::erase
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffde8,__last);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
                       0x12fcb7);
    if (bVar1) {
      in_stack_fffffffffffffdd0 =
           std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::operator->
                     ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)0x12fcce
                     );
      std::
      unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
      ::operator*((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffdc0);
      SamplePublisher::publish(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12fd07);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)peVar2,
                 (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)in_stack_fffffffffffffdb8);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              (in_stack_fffffffffffffe20,
               (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                *)in_stack_fffffffffffffe18._M_current);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffdd0);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffdd0);
    local_30 = 0;
  }
  else {
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12f48a);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              (peVar2,__fd);
    local_30 = 1;
  }
  std::
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void ClockRecovery::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  tmp_.insert(tmp_.end(), input->begin(), input->end());

  // Return read buffer (it has been copied into tmp_)
  qin->pushRead(std::move(input));

  // Omega is number of samples per symbol, so this
  // estimates the number of symbols we should find in this call.
  auto nsamples = tmp_.size();
  output->clear();
  output->reserve(nsamples / omega_);

  // Process 1 sample per iteration.
  // This does not allow vectorization but is more stable than the
  // vectorized implementation (see git history of this file).
  // It is roughly 15% slower than previous implementation.
  size_t i = 0;
  while (i < nsamples) {
    float muf;
    int mui;
    const std::complex<float>* s;

    // Populate phase and sample pointer
    muf = (float) mu_;
    mui = (int) mu_;
    s = &tmp_[i + mui];

    // Check that we don't go out of range
    if ((i + mui + 7) >= nsamples) {
      break;
    }

    // In range; update sample index and phase
    i += mui;
    mu_ -= mui;

    // Normalize mu to [0.0, 1.0) so we can use it to
    // choose the right interpolation filter.
    muf = muf - (float) mui;

    // Run interpolator to get interpolated samples at offset mu
    std::complex<float> acc = 0.0f;
    const auto taps = mmseTaps[(int) (muf * 128.0f)];
    for (auto k = 0; k < NUM_TAPS; k++) {
      acc += taps[k] * s[k];
    }

    // Push down sample
    p2t_ = p1t_;
    p1t_ = p0t_;
    p0t_ = acc;

    // Push down associated complex quadrant
    c2t_ = c1t_;
    c1t_ = c0t_;
    c0t_.real((p0t_.real() > 0.0f ? 1.0f : 0.0f));
    c0t_.imag((p0t_.imag() > 0.0f ? 1.0f : 0.0f));

    // Use interpolated sample as output
    // Then use the estimated error to update omega_ and mu_
    output->push_back(p0t_);

    // Compute error
    std::complex<float> x = (c0t_ - c2t_) * std::conj(p1t_);
    std::complex<float> y = (p0t_ - p2t_) * std::conj(c1t_);
    std::complex<float> u = y - x;

    // Clip error to [-1.0, 1.0]
    float mm = u.real();
    mm = 0.5f * (fabsf(mm + 1.0f) - fabsf(mm - 1.0f));

    // Update omega
    omega_ += omegaGain_ * mm;

    // Wrap omega if it hits the lower or upper bound.
    // If the algorithm is biased to always increase omega at a
    // certain point, it will wrap and start from minimum, in the
    // hope it locks on to the signal again.
    if (omega_ < omegaMin_) {
      omega_ = omegaMax_;
    }
    if (omega_ > omegaMax_) {
      omega_ = omegaMin_;
    }

    // Update mu with new omega
    // It is OK if this is bigger than 1.0 because that means
    // we need to skip a few samples in the next iteration.
    mu_ += omega_ + muGain_ * mm;
  }

  // Index i was not used yet. Copy the sample at index i and
  // everything after it to the beginning of the sample buffer.
  tmp_.erase(tmp_.begin(), tmp_.begin() + i);

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}